

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm.cpp
# Opt level: O0

int __thiscall ncnn::BatchNorm::forward_inplace(BatchNorm *this,Mat *bottom_top_blob)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  Mat *in_RSI;
  long in_RDI;
  int i_2;
  float b_1;
  float a_1;
  float *ptr_2;
  int q;
  int size;
  int h_1;
  int w_2;
  int j;
  float b;
  float a;
  float *ptr_1;
  int i_1;
  int h;
  int w_1;
  int i;
  float *ptr;
  int w;
  int dims;
  float *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  int local_a8;
  Mat local_90;
  float *local_60;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  float local_40;
  float local_3c;
  float *local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  float *local_20;
  int local_18;
  int local_14;
  Mat *local_10;
  
  local_14 = in_RSI->dims;
  local_10 = in_RSI;
  if (local_14 == 1) {
    local_18 = in_RSI->w;
    local_20 = Mat::operator_cast_to_float_(in_RSI);
    for (local_24 = 0; local_24 < local_18; local_24 = local_24 + 1) {
      pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x178),local_24);
      in_stack_ffffffffffffff4c = *pfVar3 * local_20[local_24];
      pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x148),local_24);
      local_20[local_24] = in_stack_ffffffffffffff4c + *pfVar3;
    }
  }
  if (local_14 == 2) {
    local_28 = local_10->w;
    local_2c = local_10->h;
    for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
      local_38 = Mat::row(local_10,local_30);
      pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x148),local_30);
      local_3c = *pfVar3;
      pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x178),local_30);
      local_40 = *pfVar3;
      for (local_44 = 0; local_44 < local_28; local_44 = local_44 + 1) {
        local_38[local_44] = local_40 * local_38[local_44] + local_3c;
      }
    }
  }
  if (local_14 == 3) {
    local_48 = local_10->w;
    local_4c = local_10->h;
    local_50 = local_48 * local_4c;
    for (local_54 = 0; local_54 < *(int *)(in_RDI + 0x80); local_54 = local_54 + 1) {
      Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
      in_stack_ffffffffffffff40 = Mat::operator_cast_to_float_(&local_90);
      Mat::~Mat((Mat *)0x10f71b);
      local_60 = in_stack_ffffffffffffff40;
      pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x148),local_54);
      fVar1 = *pfVar3;
      pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x178),local_54);
      fVar2 = *pfVar3;
      for (local_a8 = 0; local_a8 < local_50; local_a8 = local_a8 + 1) {
        local_60[local_a8] = fVar2 * local_60[local_a8] + fVar1;
      }
    }
  }
  return 0;
}

Assistant:

int BatchNorm::forward_inplace(Mat& bottom_top_blob) const
{
    // a = bias - slope * mean / sqrt(var)
    // b = slope / sqrt(var)
    // value = b * value + a

    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        #pragma omp parallel for
        for (int i=0; i<w; i++)
        {
            ptr[i] = b_data[i] * ptr[i] + a_data[i];
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        #pragma omp parallel for
        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

            for (int j=0; j<w; j++)
            {
                ptr[j] = b * ptr[j] + a;
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int size = w * h;

        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

            for (int i=0; i<size; i++)
            {
                ptr[i] = b * ptr[i] + a;
            }
        }
    }

    return 0;
}